

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

void duckdb::BitwiseANDOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  value_type vVar2;
  value_type vVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  ulong uVar12;
  UnifiedVectorFormat *pUVar13;
  string_t *psVar14;
  string_t *psVar15;
  string_t *psVar16;
  undefined8 *puVar17;
  VectorType VVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  UnifiedVectorFormat *pUVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  anon_union_16_2_67f50693_for_value aVar25;
  string_t target_7;
  string_t target;
  anon_union_16_2_67f50693_for_value local_138;
  string_t *local_128;
  ulong local_120;
  UnifiedVectorFormat *local_118;
  string_t *local_110;
  Vector *local_108;
  ulong local_100;
  string_t *local_f8;
  ulong local_f0;
  anon_union_16_2_67f50693_for_value local_e8;
  long local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string_t *local_a0;
  string_t *local_98;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar18 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar18);
    psVar14 = *(string_t **)(vector_00 + 0x20);
    paVar4 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      local_a0 = (string_t *)**(ulong **)(vector + 0x20);
      local_98 = (string_t *)(*(ulong **)(vector + 0x20))[1];
      local_138._0_8_ = *(undefined8 *)&psVar14->value;
      local_138.pointer.ptr = (psVar14->value).pointer.ptr;
      local_e8 = (anon_union_16_2_67f50693_for_value)
                 duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
      duckdb::Bit::BitwiseAnd
                ((Bit *)&local_a0,(string_t *)&local_138.pointer,(string_t *)&local_e8.pointer,
                 psVar14);
      paVar4->pointer = (anon_struct_16_3_d7536bce_for_pointer)local_e8;
      return;
    }
  }
  else {
    pUVar20 = *(UnifiedVectorFormat **)(args + 0x18);
    local_118 = pUVar20;
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      local_108 = *(Vector **)(vector_00 + 0x20);
      local_100 = *(ulong *)(vector + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar18);
        local_128 = *(string_t **)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar20 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar12 = *(ulong *)local_108;
          pcVar7 = *(char **)((long)local_108 + 8);
          lVar22 = 8;
          do {
            local_a0 = *(string_t **)((local_100 - 8) + lVar22);
            psVar14 = *(string_t **)(local_100 + lVar22);
            local_138._0_8_ = uVar12;
            local_138.pointer.ptr = pcVar7;
            local_98 = psVar14;
            aVar25 = (anon_union_16_2_67f50693_for_value)
                     duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
            local_e8 = aVar25;
            duckdb::Bit::BitwiseAnd
                      ((Bit *)&local_a0,(string_t *)&local_138.pointer,(string_t *)&local_e8.pointer
                       ,psVar14);
            ((anon_union_16_2_67f50693_for_value *)((long)local_128 + -8 + lVar22))->pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)local_e8;
            lVar22 = lVar22 + 0x10;
            local_118 = local_118 + -1;
          } while (local_118 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar20 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar12 = (ulong)(pUVar20 + 0x3f) >> 6;
        local_120 = 0;
        pUVar20 = (UnifiedVectorFormat *)0x0;
        local_f0 = uVar12;
        do {
          uVar19 = local_100;
          psVar14 = local_128;
          if (*(long *)(result + 0x28) == 0) {
            pUVar9 = pUVar20 + 0x40;
            if (local_118 <= pUVar20 + 0x40) {
              pUVar9 = local_118;
            }
LAB_006f8d3f:
            pUVar13 = pUVar20;
            if (pUVar20 < pUVar9) {
              local_f8 = *(string_t **)local_108;
              local_110 = *(string_t **)((long)local_108 + 8);
              uVar24 = (long)pUVar20 << 4 | 8;
              do {
                local_a0 = *(string_t **)((uVar19 - 8) + uVar24);
                local_98 = *(string_t **)(uVar19 + uVar24);
                local_138._0_8_ = local_f8;
                local_138.pointer.ptr = (char *)local_110;
                psVar16 = local_110;
                aVar25 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
                local_e8 = aVar25;
                duckdb::Bit::BitwiseAnd
                          ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                           (string_t *)&local_e8.pointer,psVar16);
                ((anon_union_16_2_67f50693_for_value *)((long)psVar14 + -8 + uVar24))->pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                pUVar20 = pUVar20 + 1;
                uVar24 = uVar24 + 0x10;
                uVar12 = local_f0;
                pUVar13 = pUVar9;
              } while (pUVar9 != pUVar20);
            }
          }
          else {
            uVar24 = *(ulong *)(*(long *)(result + 0x28) + local_120 * 8);
            pUVar9 = pUVar20 + 0x40;
            if (local_118 <= pUVar20 + 0x40) {
              pUVar9 = local_118;
            }
            pUVar13 = pUVar9;
            if (uVar24 != 0) {
              if (uVar24 == 0xffffffffffffffff) goto LAB_006f8d3f;
              pUVar13 = pUVar20;
              if (pUVar20 < pUVar9) {
                uVar19 = (long)pUVar20 << 4 | 8;
                uVar23 = 0;
                do {
                  if ((uVar24 >> (uVar23 & 0x3f) & 1) != 0) {
                    local_a0 = *(string_t **)((local_100 - 8) + uVar19);
                    psVar16 = *(string_t **)(local_100 + uVar19);
                    local_138._0_8_ = *(undefined8 *)local_108;
                    local_138.pointer.ptr = (char *)*(ulong *)((long)local_108 + 8);
                    local_98 = psVar16;
                    aVar25 = (anon_union_16_2_67f50693_for_value)
                             duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
                    local_e8 = aVar25;
                    duckdb::Bit::BitwiseAnd
                              ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                               (string_t *)&local_e8.pointer,psVar16);
                    ((anon_union_16_2_67f50693_for_value *)((long)psVar14 + -8 + uVar19))->pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                  }
                  uVar23 = uVar23 + 1;
                  uVar19 = uVar19 + 0x10;
                  uVar12 = local_f0;
                  pUVar13 = pUVar9;
                } while ((long)pUVar9 - (long)pUVar20 != uVar23);
              }
            }
          }
          local_120 = local_120 + 1;
          pUVar20 = pUVar13;
          if (local_120 == uVar12) {
            return;
          }
        } while( true );
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          local_f8 = *(string_t **)(vector + 0x20);
          local_110 = *(string_t **)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar18);
          local_100 = *(ulong *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          local_108 = result + 0x28;
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          uVar12 = local_100;
          psVar14 = local_110;
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar20 != (UnifiedVectorFormat *)0x0) {
              lVar22 = 8;
              do {
                local_a0 = *(string_t **)((long)local_f8 + -8 + lVar22);
                psVar16 = *(string_t **)((long)local_f8 + lVar22);
                puVar17 = (undefined8 *)((long)psVar14 + -8 + lVar22);
                local_138._0_8_ = *puVar17;
                local_138.pointer.ptr = (char *)puVar17[1];
                local_98 = psVar16;
                aVar25 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
                local_e8 = aVar25;
                duckdb::Bit::BitwiseAnd
                          ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                           (string_t *)&local_e8.pointer,psVar16);
                ((anon_union_16_2_67f50693_for_value *)(uVar12 + -8 + lVar22))->pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                lVar22 = lVar22 + 0x10;
                local_118 = local_118 + -1;
              } while (local_118 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar20 + 0x3f) {
            uVar12 = (ulong)(pUVar20 + 0x3f) >> 6;
            local_128 = (string_t *)0x0;
            pUVar20 = (UnifiedVectorFormat *)0x0;
            local_120 = uVar12;
            do {
              psVar16 = local_f8;
              uVar19 = local_100;
              if (*(long *)local_108 == 0) {
                pUVar9 = pUVar20 + 0x40;
                if (local_118 <= pUVar20 + 0x40) {
                  pUVar9 = local_118;
                }
LAB_006f9361:
                pUVar13 = pUVar20;
                if (pUVar20 < pUVar9) {
                  uVar24 = (long)pUVar20 << 4 | 8;
                  do {
                    local_a0 = *(string_t **)((long)psVar16 + -8 + uVar24);
                    psVar15 = *(string_t **)((long)psVar16 + uVar24);
                    puVar17 = (undefined8 *)((long)psVar14 + -8 + uVar24);
                    local_138._0_8_ = *puVar17;
                    local_138.pointer.ptr = (char *)puVar17[1];
                    local_98 = psVar15;
                    aVar25 = (anon_union_16_2_67f50693_for_value)
                             duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
                    local_e8 = aVar25;
                    duckdb::Bit::BitwiseAnd
                              ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                               (string_t *)&local_e8.pointer,psVar15);
                    ((anon_union_16_2_67f50693_for_value *)(uVar19 + -8 + uVar24))->pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                    pUVar20 = pUVar20 + 1;
                    uVar24 = uVar24 + 0x10;
                    pUVar13 = pUVar9;
                    uVar12 = local_120;
                  } while (pUVar9 != pUVar20);
                }
              }
              else {
                uVar24 = *(ulong *)(*(long *)local_108 + (long)local_128 * 8);
                pUVar9 = pUVar20 + 0x40;
                if (local_118 <= pUVar20 + 0x40) {
                  pUVar9 = local_118;
                }
                psVar14 = local_110;
                pUVar13 = pUVar9;
                if (uVar24 != 0) {
                  if (uVar24 == 0xffffffffffffffff) goto LAB_006f9361;
                  pUVar13 = pUVar20;
                  uVar12 = local_120;
                  if (pUVar20 < pUVar9) {
                    uVar19 = (long)pUVar20 << 4 | 8;
                    uVar23 = 0;
                    do {
                      if ((uVar24 >> (uVar23 & 0x3f) & 1) != 0) {
                        local_a0 = *(string_t **)((long)local_f8 + -8 + uVar19);
                        psVar14 = *(string_t **)((long)local_f8 + uVar19);
                        puVar17 = (undefined8 *)((long)local_110 + -8 + uVar19);
                        local_138._0_8_ = *puVar17;
                        local_138.pointer.ptr = (char *)puVar17[1];
                        local_98 = psVar14;
                        aVar25 = (anon_union_16_2_67f50693_for_value)
                                 duckdb::StringVector::EmptyString
                                           (result,(ulong)local_a0 & 0xffffffff);
                        local_e8 = aVar25;
                        duckdb::Bit::BitwiseAnd
                                  ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                                   (string_t *)&local_e8.pointer,psVar14);
                        ((anon_union_16_2_67f50693_for_value *)(local_100 + -8 + uVar19))->pointer =
                             (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                      }
                      uVar23 = uVar23 + 1;
                      uVar19 = uVar19 + 0x10;
                      psVar14 = local_110;
                      pUVar13 = pUVar9;
                      uVar12 = local_120;
                    } while ((long)pUVar9 - (long)pUVar20 != uVar23);
                  }
                }
              }
              local_128 = (string_t *)((long)local_128 + 1);
              pUVar20 = pUVar13;
            } while (local_128 != (string_t *)uVar12);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e8.pointer)
          ;
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_a0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar20);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar20);
          duckdb::Vector::SetVectorType(VVar18);
          lVar22 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_90 == 0 && local_d8 == 0) {
            if (pUVar20 != (UnifiedVectorFormat *)0x0) {
              lVar5 = *(long *)local_e8._0_8_;
              lVar6 = *(long *)local_a0;
              puVar17 = (undefined8 *)(lVar22 + 8);
              pUVar20 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar9 = pUVar20;
                if (lVar5 != 0) {
                  pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)pUVar20 * 4);
                }
                pUVar13 = pUVar20;
                if (lVar6 != 0) {
                  pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar20 * 4);
                }
                local_58 = *(ulong *)(local_e8.pointer.ptr + (long)pUVar9 * 0x10);
                local_50 = *(undefined8 *)(local_e8.pointer.ptr + (long)pUVar9 * 0x10 + 8);
                psVar14 = (string_t *)((long)pUVar13 * 0x10);
                puVar1 = (undefined8 *)((long)&psVar14->value + (long)local_98);
                local_40._0_8_ = *puVar1;
                local_40.pointer.ptr = (char *)puVar1[1];
                aVar25 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(result,local_58 & 0xffffffff);
                local_138 = aVar25;
                duckdb::Bit::BitwiseAnd
                          ((Bit *)&local_58,(string_t *)&local_40.pointer,
                           (string_t *)&local_138.pointer,psVar14);
                puVar17[-1] = local_138._0_8_;
                *puVar17 = local_138.pointer.ptr;
                pUVar20 = pUVar20 + 1;
                puVar17 = puVar17 + 2;
              } while (local_118 != pUVar20);
            }
          }
          else if (pUVar20 != (UnifiedVectorFormat *)0x0) {
            lVar5 = *(long *)local_e8._0_8_;
            lVar6 = *(long *)local_a0;
            puVar17 = (undefined8 *)(lVar22 + 8);
            pUVar20 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar9 = pUVar20;
              if (lVar5 != 0) {
                pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar5 + (long)pUVar20 * 4);
              }
              pUVar13 = pUVar20;
              if (lVar6 != 0) {
                pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar20 * 4);
              }
              if (((local_d8 == 0) ||
                  ((*(ulong *)(local_d8 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1)
                   != 0)) &&
                 ((local_90 == 0 ||
                  ((*(ulong *)(local_90 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1)
                   != 0)))) {
                local_58 = *(ulong *)(local_e8.pointer.ptr + (long)pUVar9 * 0x10);
                local_50 = *(undefined8 *)(local_e8.pointer.ptr + (long)pUVar9 * 0x10 + 8);
                psVar14 = (string_t *)((long)pUVar13 * 0x10);
                puVar1 = (undefined8 *)((long)&psVar14->value + (long)local_98);
                local_40._0_8_ = *puVar1;
                local_40.pointer.ptr = (char *)puVar1[1];
                aVar25 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(result,local_58 & 0xffffffff);
                local_138 = aVar25;
                duckdb::Bit::BitwiseAnd
                          ((Bit *)&local_58,(string_t *)&local_40.pointer,
                           (string_t *)&local_138.pointer,psVar14);
                puVar17[-1] = local_138._0_8_;
                *puVar17 = local_138.pointer.ptr;
              }
              else {
                _Var11._M_head_impl = *(unsigned_long **)(result + 0x28);
                if (_Var11._M_head_impl == (unsigned_long *)0x0) {
                  local_58 = *(ulong *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_138.pointer,&local_58);
                  aVar25 = local_138;
                  local_138._0_8_ = 0;
                  local_138.pointer.ptr = (char *)0x0;
                  ((anon_union_16_2_67f50693_for_value *)(result + 0x30))->pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)aVar25;
                  if ((*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) !=
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38)),
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.pointer.ptr !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.pointer.ptr
                              );
                  }
                  pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  _Var11._M_head_impl =
                       (pTVar10->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(result + 0x28) = _Var11._M_head_impl;
                }
                bVar8 = (byte)pUVar20 & 0x3f;
                _Var11._M_head_impl[(ulong)pUVar20 >> 6] =
                     _Var11._M_head_impl[(ulong)pUVar20 >> 6] &
                     (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              pUVar20 = pUVar20 + 1;
              puVar17 = puVar17 + 2;
            } while (local_118 != pUVar20);
          }
          if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
          }
        }
        return;
      }
      local_108 = *(Vector **)(vector + 0x20);
      psVar14 = *(string_t **)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        local_128 = psVar14;
        duckdb::Vector::SetVectorType(VVar18);
        local_120 = *(ulong *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar20 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar12 = *(ulong *)local_108;
          uVar19 = *(ulong *)((long)local_108 + 8);
          lVar22 = 8;
          do {
            puVar17 = (undefined8 *)((long)local_128 + lVar22 + -8);
            local_138._0_8_ = *puVar17;
            local_138.pointer.ptr = (char *)puVar17[1];
            local_a0 = (string_t *)uVar12;
            local_98 = (string_t *)uVar19;
            aVar25 = (anon_union_16_2_67f50693_for_value)
                     duckdb::StringVector::EmptyString(result,uVar12 & 0xffffffff);
            local_e8 = aVar25;
            duckdb::Bit::BitwiseAnd
                      ((Bit *)&local_a0,(string_t *)&local_138.pointer,(string_t *)&local_e8.pointer
                       ,psVar14);
            ((anon_union_16_2_67f50693_for_value *)(local_120 + -8 + lVar22))->pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)local_e8;
            lVar22 = lVar22 + 0x10;
            local_118 = local_118 + -1;
          } while (local_118 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar20 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar12 = (ulong)(pUVar20 + 0x3f) >> 6;
        local_f0 = 0;
        pUVar20 = (UnifiedVectorFormat *)0x0;
        local_48 = uVar12;
        do {
          uVar19 = local_120;
          psVar14 = local_128;
          if (*(long *)(result + 0x28) == 0) {
            pUVar9 = pUVar20 + 0x40;
            if (local_118 <= pUVar20 + 0x40) {
              pUVar9 = local_118;
            }
LAB_006f90db:
            pUVar13 = pUVar20;
            if (pUVar20 < pUVar9) {
              psVar16 = *(string_t **)local_108;
              local_110 = *(string_t **)((long)local_108 + 8);
              local_100 = (ulong)psVar16 & 0xffffffff;
              uVar24 = (long)pUVar20 << 4 | 8;
              local_f8 = psVar16;
              do {
                puVar17 = (undefined8 *)((long)psVar14 + (uVar24 - 8));
                local_138._0_8_ = *puVar17;
                local_138.pointer.ptr = (char *)puVar17[1];
                local_a0 = local_f8;
                local_98 = local_110;
                aVar25 = (anon_union_16_2_67f50693_for_value)
                         duckdb::StringVector::EmptyString(result,local_100);
                local_e8 = aVar25;
                duckdb::Bit::BitwiseAnd
                          ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                           (string_t *)&local_e8.pointer,psVar16);
                ((anon_union_16_2_67f50693_for_value *)(uVar19 + -8 + uVar24))->pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                pUVar20 = pUVar20 + 1;
                uVar24 = uVar24 + 0x10;
                uVar12 = local_48;
                pUVar13 = pUVar9;
              } while (pUVar9 != pUVar20);
            }
          }
          else {
            uVar24 = *(ulong *)(*(long *)(result + 0x28) + local_f0 * 8);
            pUVar9 = pUVar20 + 0x40;
            if (local_118 <= pUVar20 + 0x40) {
              pUVar9 = local_118;
            }
            pUVar13 = pUVar9;
            if (uVar24 != 0) {
              if (uVar24 == 0xffffffffffffffff) goto LAB_006f90db;
              pUVar13 = pUVar20;
              if (pUVar20 < pUVar9) {
                uVar23 = (long)pUVar20 << 4 | 8;
                uVar21 = 0;
                do {
                  if ((uVar24 >> (uVar21 & 0x3f) & 1) != 0) {
                    local_a0 = *(string_t **)local_108;
                    psVar16 = *(string_t **)((long)local_108 + 8);
                    puVar17 = (undefined8 *)((long)psVar14 + (uVar23 - 8));
                    local_138._0_8_ = *puVar17;
                    local_138.pointer.ptr = (char *)puVar17[1];
                    local_98 = psVar16;
                    aVar25 = (anon_union_16_2_67f50693_for_value)
                             duckdb::StringVector::EmptyString(result,(ulong)local_a0 & 0xffffffff);
                    local_e8 = aVar25;
                    duckdb::Bit::BitwiseAnd
                              ((Bit *)&local_a0,(string_t *)&local_138.pointer,
                               (string_t *)&local_e8.pointer,psVar16);
                    ((anon_union_16_2_67f50693_for_value *)(uVar19 + -8 + uVar23))->pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)local_e8;
                  }
                  uVar21 = uVar21 + 1;
                  uVar23 = uVar23 + 0x10;
                  uVar12 = local_48;
                  pUVar13 = pUVar9;
                } while ((long)pUVar9 - (long)pUVar20 != uVar21);
              }
            }
          }
          local_f0 = local_f0 + 1;
          pUVar20 = pUVar13;
          if (local_f0 == uVar12) {
            return;
          }
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar18);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitwiseANDOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t rhs, string_t lhs) {
		    string_t target = StringVector::EmptyString(result, rhs.GetSize());

		    Bit::BitwiseAnd(rhs, lhs, target);
		    return target;
	    });
}